

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O3

void ymf262_set_mute_mask(void *chip,UINT32 MuteMask)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar1 = _DAT_00172610;
  lVar2 = (long)chip + 0x10e;
  lVar3 = 0;
  auVar6 = _DAT_00172600;
  do {
    auVar5 = auVar6 ^ auVar1;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7fffffee) {
      *(bool *)lVar2 = (MuteMask >> ((uint)lVar3 & 0x1f) & 1) != 0;
      *(bool *)(lVar2 + 0xf0) = (MuteMask >> ((uint)lVar3 + 1 & 0x1f) & 1) != 0;
    }
    lVar3 = lVar3 + 2;
    lVar4 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar4 + 2;
    lVar2 = lVar2 + 0x1e0;
  } while (lVar3 != 0x12);
  lVar2 = 0;
  auVar5 = _DAT_00172600;
  do {
    auVar6 = auVar5 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffffb) {
      *(bool *)((long)chip + lVar2 + 0x1268) = (MuteMask >> ((int)lVar2 + 0x12U & 0x1f) & 1) != 0;
      *(bool *)((long)chip + lVar2 + 0x1269) = (MuteMask >> ((int)lVar2 + 0x13U & 0x1f) & 1) != 0;
    }
    lVar2 = lVar2 + 2;
    lVar3 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar3 + 2;
  } while (lVar2 != 6);
  return;
}

Assistant:

void ymf262_set_mute_mask(void *chip, UINT32 MuteMask)
{
	OPL3 *opl3 = (OPL3 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 18; CurChn ++)
		opl3->P_CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 5; CurChn ++)
		opl3->MuteSpc[CurChn] = (MuteMask >> (CurChn + 18)) & 0x01;
	
	return;
}